

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::ReverseLayerParams::_internal_add_reversedim
          (ReverseLayerParams *this,bool value)

{
  RepeatedField<bool> *this_00;
  uint uVar1;
  uint uVar2;
  bool *pbVar3;
  
  this_00 = &this->reversedim_;
  uVar1 = (this->reversedim_).current_size_;
  uVar2 = (this->reversedim_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<bool>::Reserve(this_00,uVar2 + 1);
  }
  pbVar3 = google::protobuf::RepeatedField<bool>::elements(this_00);
  pbVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void ReverseLayerParams::_internal_add_reversedim(bool value) {
  reversedim_.Add(value);
}